

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  char *pcVar1;
  double value;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 aVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  EnumDescriptor *this_00;
  DescriptorPool *pDVar6;
  Symbol SVar7;
  string *psVar8;
  Type type;
  UninterpretedOption *pUVar9;
  ulong uVar10;
  int64_t value_00;
  pointer pcVar11;
  uint64_t uVar12;
  code *pcVar13;
  DescriptorPool *pDVar14;
  size_type sVar15;
  DescriptorBuilder *this_01;
  ulong *puVar16;
  float value_01;
  string_view name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view name_00;
  string_view element_name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  string fully_qualified_name;
  EnumDescriptor *enum_type;
  FieldDescriptor *local_78;
  VoidPtr local_70;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_68;
  long local_60 [2];
  EnumDescriptor **local_50;
  ulong *local_48;
  FieldDescriptor **local_40;
  EnumDescriptor *local_38;
  
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4) - 1U)
  goto LAB_00172299;
  type = (Type)option_field->type_;
  local_78 = option_field;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4)) {
  case 1:
    pUVar9 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        uVar10 = *(ulong *)((long)&pUVar9->field_0 + 0x40);
        if (-0x80000001 < (long)uVar10) goto LAB_0017211f;
        pcVar13 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
        ;
LAB_0017225d:
        local_70.obj = &local_78;
        make_error_01.ptr_.obj = &local_70;
        make_error_01.invoker_ = pcVar13;
        bVar4 = AddValueError(this,make_error_01);
        goto LAB_0017229c;
      }
      this_01 = this->builder_;
      pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__2,std::__cxx11::string>
      ;
    }
    else {
      uVar10 = *(ulong *)((long)&pUVar9->field_0 + 0x38);
      if ((uVar10 & 0xffffffff80000000) == 0) {
LAB_0017211f:
        SetInt32(this,option_field->number_,(int32_t)uVar10,type,unknown_fields);
        goto LAB_00172299;
      }
      this_01 = this->builder_;
      pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
      ;
    }
    break;
  case 2:
    pUVar9 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        iVar5 = option_field->number_;
        value_00 = *(int64_t *)((long)&pUVar9->field_0 + 0x40);
LAB_00172138:
        SetInt64(this,iVar5,value_00,type,unknown_fields);
        goto LAB_00172299;
      }
      this_01 = this->builder_;
      pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__4,std::__cxx11::string>
      ;
    }
    else {
      value_00 = *(long *)((long)&pUVar9->field_0 + 0x38);
      if (-1 < value_00) {
        iVar5 = option_field->number_;
        goto LAB_00172138;
      }
      this_01 = this->builder_;
      pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__3,std::__cxx11::string>
      ;
    }
    break;
  case 3:
    pUVar9 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x8) ==
        (undefined1  [80])0x0) {
      this_01 = this->builder_;
      pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__6,std::__cxx11::string>
      ;
    }
    else {
      uVar10 = *(ulong *)((long)&pUVar9->field_0 + 0x38);
      if (uVar10 >> 0x20 == 0) {
        SetUInt32(this,option_field->number_,(uint32_t)uVar10,type,unknown_fields);
        goto LAB_00172299;
      }
      this_01 = this->builder_;
      pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__5,std::__cxx11::string>
      ;
    }
    break;
  case 4:
    pUVar9 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x8) !=
        (undefined1  [80])0x0) {
      SetUInt64(this,option_field->number_,*(uint64_t *)((long)&pUVar9->field_0 + 0x38),type,
                unknown_fields);
      goto LAB_00172299;
    }
    this_01 = this->builder_;
    pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,std::__cxx11::string>
    ;
    break;
  case 5:
    pUVar9 = this->uninterpreted_option_;
    aVar2 = pUVar9->field_0;
    if (((undefined1  [80])aVar2 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar2 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar2 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((ulong)(pUVar9->field_0)._impl_.identifier_value_.tagged_ptr_.
                                             ptr_ & 0xfffffffffffffffc));
          if (iVar5 == 0) {
            value = INFINITY;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc));
            if (iVar5 != 0) {
              pcVar13 = absl::lts_20250127::functional_internal::
                        InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__9,std::__cxx11::string>
              ;
              goto LAB_0017225d;
            }
            value = NAN;
          }
        }
        else {
          value = (double)(pUVar9->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar12 = (pUVar9->field_0)._impl_.positive_int_value_;
        value = ((double)CONCAT44(0x45300000,(int)(uVar12 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
      }
    }
    else {
      value = (pUVar9->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed64(unknown_fields,option_field->number_,(uint64_t)value);
    goto LAB_00172299;
  case 6:
    pUVar9 = this->uninterpreted_option_;
    aVar2 = pUVar9->field_0;
    if (((undefined1  [80])aVar2 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar2 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar2 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((ulong)(pUVar9->field_0)._impl_.identifier_value_.tagged_ptr_.
                                             ptr_ & 0xfffffffffffffffc));
          if (iVar5 == 0) {
            value_01 = INFINITY;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc));
            if (iVar5 != 0) {
              pcVar13 = absl::lts_20250127::functional_internal::
                        InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__8,std::__cxx11::string>
              ;
              goto LAB_0017225d;
            }
            value_01 = NAN;
          }
        }
        else {
          value_01 = (float)(pUVar9->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar10 = (pUVar9->field_0)._impl_.positive_int_value_;
        if ((long)uVar10 < 0) {
          value_01 = (float)uVar10;
        }
        else {
          value_01 = (float)(long)uVar10;
        }
      }
    }
    else {
      value_01 = (float)(pUVar9->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed32(unknown_fields,option_field->number_,(uint32_t)value_01);
LAB_00172299:
    bVar4 = 1;
    goto LAB_0017229c;
  case 7:
    pUVar9 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x1) !=
        (undefined1  [80])0x0) {
      iVar5 = std::__cxx11::string::compare
                        ((char *)((ulong)(pUVar9->field_0)._impl_.identifier_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc));
      if (iVar5 == 0) {
        uVar12 = 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                           identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
        ;
        if (iVar5 != 0) {
          pcVar13 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__11,std::__cxx11::string>
          ;
          goto LAB_0017225d;
        }
        uVar12 = 0;
      }
      iVar5 = option_field->number_;
LAB_0017223b:
      UnknownFieldSet::AddVarint(unknown_fields,iVar5,uVar12);
      goto LAB_00172299;
    }
    this_01 = this->builder_;
    pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__10,std::__cxx11::string>
    ;
    break;
  case 8:
    pUVar9 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x1) !=
        (undefined1  [80])0x0) {
      this_00 = FieldDescriptor::enum_type(option_field);
      puVar16 = (ulong *)((ulong)(this->uninterpreted_option_->field_0)._impl_.identifier_value_.
                                 tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      pDVar14 = this_00->file_->pool_;
      local_38 = this_00;
      pDVar6 = DescriptorPool::internal_generated_pool();
      DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
      pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
      if (pDVar14 == pDVar6) {
        name_00._M_str = (char *)*puVar16;
        name_00._M_len = puVar16[1];
        SVar7.ptr_ = (SymbolBase *)EnumDescriptor::FindValueByName(this_00,name_00);
      }
      else {
        pcVar1 = (this_00->all_names_).payload_;
        local_70.obj = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar1 + ~(ulong)*(ushort *)(pcVar1 + 2),pcVar1 + -1);
        std::__cxx11::string::resize
                  ((ulong)&local_70,
                   (char)p_Stack_68 - (char)*(undefined2 *)(this_00->all_names_).payload_);
        std::__cxx11::string::_M_append((char *)&local_70,*puVar16);
        name._M_str = (char *)local_70.obj;
        name._M_len = (size_t)p_Stack_68;
        SVar7 = FindSymbolNotEnforcingDeps(this->builder_,name,true);
        bVar3 = true;
        if ((SVar7.ptr_)->symbol_type_ == '\x05') {
LAB_00171f86:
          if (((EnumValueDescriptor *)SVar7.ptr_)->type_ != this_00) {
            local_50 = &local_38;
            local_40 = &local_78;
            make_error_00.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__13,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = &local_50;
            local_48 = puVar16;
            bVar3 = AddValueError(this,make_error_00);
            pDVar14 = (DescriptorPool *)(ulong)bVar3;
            SVar7.ptr_ = (SymbolBase *)0x0;
            bVar3 = false;
          }
        }
        else {
          if ((SVar7.ptr_)->symbol_type_ == '\x06') {
            SVar7.ptr_ = SVar7.ptr_ + -1;
            goto LAB_00171f86;
          }
          SVar7.ptr_ = (SymbolBase *)0x0;
        }
        bVar4 = (byte)pDVar14;
        if ((long *)local_70.obj != local_60) {
          operator_delete(local_70.obj,local_60[0] + 1);
        }
        if (!bVar3) goto LAB_0017229c;
      }
      if ((EnumValueDescriptor *)SVar7.ptr_ == (EnumValueDescriptor *)0x0) {
        pcVar13 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,std::__cxx11::string>
        ;
        p_Stack_68 = (Invoker<std::__cxx11::basic_string<char>_>)puVar16;
        goto LAB_0017225d;
      }
      iVar5 = local_78->number_;
      uVar12 = (uint64_t)((EnumValueDescriptor *)SVar7.ptr_)->number_;
      goto LAB_0017223b;
    }
    this_01 = this->builder_;
    pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__12,std::__cxx11::string>
    ;
    break;
  case 9:
    pUVar9 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar9->field_0 & (undefined1  [80])0x2) !=
        (undefined1  [80])0x0) {
      uVar10 = *(ulong *)((ulong)(pUVar9->field_0)._impl_.string_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc);
      psVar8 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,option_field->number_);
      std::__cxx11::string::_M_replace((ulong)psVar8,0,(char *)psVar8->_M_string_length,uVar10);
      goto LAB_00172299;
    }
    this_01 = this->builder_;
    pcVar11 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__15,std::__cxx11::string>
    ;
    break;
  case 10:
    bVar3 = SetAggregateOption(this,option_field,unknown_fields);
    if (bVar3) goto LAB_00172299;
    goto LAB_001721ba;
  }
  local_50 = (EnumDescriptor **)&local_78;
  local_70.obj = &local_50;
  make_error.invoker_ = p_Stack_68;
  make_error.ptr_.obj = local_70.obj;
  element_name._M_str = pcVar11;
  element_name._M_len = sVar15;
  AddError(this_01,element_name,&pUVar9->super_Message,OPTION_VALUE,make_error);
LAB_001721ba:
  bVar4 = 0;
LAB_0017229c:
  return (bool)(bVar4 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int32_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64_t>(std::numeric_limits<int32_t>::min())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int32_t>("int32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int64_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int64_t>("int64", option_field->full_name());
          });
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int64_t>("int64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            std::numeric_limits<uint32_t>::max()) {
          return AddValueError([&] {
            return ValueOutOfRange<uint32_t>("uint32",
                                             option_field->full_name());
          });
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint32_t>("uint32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint64_t>("uint64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<float>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<float>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for float option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<double>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<double>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for double option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64_t value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat("Value must be identifier for boolean option \"",
                              option_field->full_name(), "\".");
        });
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be \"true\" or \"false\" for boolean option \"",
              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be identifier for enum-valued option \"",
              option_field->full_name(), "\".");
        });
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = std::string(enum_type->full_name());
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (auto* candidate_descriptor = symbol.enum_value_descriptor()) {
          if (candidate_descriptor->type() != enum_type) {
            return AddValueError([&] {
              return absl::StrCat(
                  "Enum type \"", enum_type->full_name(),
                  "\" has no value named \"", value_name, "\" for option \"",
                  option_field->full_name(),
                  "\". This appears to be a value from a sibling type.");
            });
          } else {
            enum_value = candidate_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError([&] {
          return absl::StrCat(
              "Enum type \"", option_field->enum_type()->full_name(),
              "\" has no value named \"", value_name, "\" for option \"",
              option_field->full_name(), "\".");
        });
      } else {
        // Sign-extension is not a problem, since we cast directly from int32_t
        // to uint64_t, without first going through uint32_t.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64_t>(static_cast<int64_t>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be quoted string for string option \"",
              option_field->full_name(), "\".");
        });
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}